

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

void __thiscall jsonnet::internal::Desugarer::desugar(Desugarer *this,AST **ast_,uint obj_level)

{
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *params;
  int iVar1;
  AST **ppAVar2;
  pointer pCVar3;
  bool bVar4;
  uint obj_level_00;
  long lVar5;
  ArrayComprehension *ast;
  AST *pAVar6;
  Object *ast_00;
  ObjectComprehension *ast_01;
  Var *pVVar7;
  undefined8 uVar8;
  Apply *pAVar9;
  Function *pFVar10;
  Conditional *pCVar11;
  LiteralString *pLVar12;
  ostream *poVar13;
  StaticError *this_00;
  AST **ppAVar14;
  Field *field;
  pointer pCVar15;
  Fodder *this_01;
  long lVar16;
  Bind *bind;
  pointer *args_2;
  long lVar17;
  long *plVar18;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  bool local_211;
  LocationRange *local_210;
  bool local_203;
  bool local_202;
  allocator_type local_201;
  AST **local_200;
  Index *local_1f8;
  Var *local_1f0;
  undefined1 local_1e8 [32];
  void *local_1c8;
  long local_1c0;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_1b8;
  LiteralString *local_1a0;
  AST *assert;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_188 [4];
  ArgParam local_140;
  ArgParam local_e8;
  ArgParam local_90;
  void *local_38;
  
  pAVar6 = *ast_;
  if (pAVar6 != (AST *)0x0) {
    local_210 = (LocationRange *)CONCAT44(local_210._4_4_,obj_level + 1);
    do {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Apply::typeinfo,0);
      if (lVar5 != 0) {
        desugar(this,(AST **)(lVar5 + 0x80),obj_level);
        lVar16 = *(long *)(lVar5 + 0xa8);
        for (lVar5 = *(long *)(lVar5 + 0xa0); lVar5 != lVar16; lVar5 = lVar5 + 0x58) {
          desugar(this,(AST **)(lVar5 + 0x38),obj_level);
        }
        return;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&ApplyBrace::typeinfo,0);
      if (lVar5 != 0) {
        desugar(this,(AST **)(lVar5 + 0x80),obj_level);
        desugar(this,(AST **)(lVar5 + 0x88),obj_level);
        assert = (AST *)CONCAT44(assert._4_4_,3);
        pCVar11 = (Conditional *)
                  Allocator::
                  make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                            (this->alloc,(LocationRange *)(lVar5 + 8),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)(lVar5 + 0x50),(AST **)(lVar5 + 0x80),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(BinaryOp *)&assert,(AST **)(lVar5 + 0x88));
        goto LAB_001e7140;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Array::typeinfo,0);
      if (lVar5 != 0) {
        ppAVar2 = *(AST ***)(lVar5 + 0x88);
        for (ppAVar14 = *(AST ***)(lVar5 + 0x80); ppAVar14 != ppAVar2; ppAVar14 = ppAVar14 + 4) {
          desugar(this,ppAVar14,obj_level);
        }
        return;
      }
      ast = (ArrayComprehension *)
            __dynamic_cast(pAVar6,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
      if (ast != (ArrayComprehension *)0x0) {
        pCVar3 = (ast->specs).
                 super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar15 = (ast->specs).
                       super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar15 != pCVar3;
            pCVar15 = pCVar15 + 1) {
          desugar(this,&pCVar15->expr,obj_level);
        }
        desugar(this,&ast->body,(uint)local_210);
        pCVar11 = (Conditional *)makeArrayComprehension(this,ast);
LAB_001e7140:
        *ast_ = &pCVar11->super_AST;
        return;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Assert::typeinfo,0);
      if (lVar5 != 0) {
        desugar(this,(AST **)(lVar5 + 0x80),obj_level);
        ppAVar14 = (AST **)(lVar5 + 0xa0);
        if (*(long *)(lVar5 + 0xa0) == 0) {
          assert = (AST *)local_188;
          ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                    ((u32string *)&assert,L"Assertion failed.",L"");
          local_1e8._0_4_ = 5;
          pLVar12 = Allocator::
                    make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                              (this->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                      *)&assert,(TokenKind *)local_1e8,(char (*) [1])0x25a337,
                               (char (*) [1])0x25a337);
          *ppAVar14 = &pLVar12->super_AST;
          if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)assert != local_188) {
            operator_delete(assert,local_188[0]._M_allocated_capacity * 4 + 4);
          }
        }
        local_210 = (LocationRange *)ppAVar14;
        local_200 = (AST **)(lVar5 + 0x80);
        desugar(this,ppAVar14,obj_level);
        desugar(this,(AST **)(lVar5 + 0xc0),obj_level);
        assert = &Allocator::
                  make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                            (this->alloc,(LocationRange *)(lVar5 + 8),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(AST **)local_210)->super_AST;
        pCVar11 = Allocator::
                  make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                            (this->alloc,(LocationRange *)(lVar5 + 8),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)(lVar5 + 0x50),local_200,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(AST **)(lVar5 + 0xc0),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&assert);
        goto LAB_001e7140;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Binary::typeinfo,0);
      if (lVar5 != 0) {
        desugar(this,(AST **)(lVar5 + 0x80),obj_level);
        desugar(this,(AST **)(lVar5 + 0xa8),obj_level);
        iVar1 = *(int *)(lVar5 + 0xa0);
        if (iVar1 == 0xd) {
          bVar4 = true;
        }
        else {
          if (iVar1 != 0xc) {
            if (iVar1 != 2) {
              return;
            }
            local_1e8._0_8_ = std(this);
            local_1c8 = (void *)((ulong)local_1c8 & 0xffffffffffffff00);
            assert = (AST *)local_188;
            ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                      ((u32string *)&assert,L"mod",L"");
            local_1f0 = (Var *)CONCAT44(local_1f0._4_4_,5);
            local_1f8 = (Index *)Allocator::
                                 make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                           (this->alloc,(LocationRange *)E,
                                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                             *)EF,(
                                                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                  *)&assert,(TokenKind *)&local_1f0,
                                            (char (*) [1])0x25a337,(char (*) [1])0x25a337);
            local_1f0 = (Var *)0x0;
            local_1a0 = (LiteralString *)0x0;
            local_1b8.
            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)Allocator::
                          make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                    (this->alloc,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(Var **)local_1e8,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(bool *)&local_1c8,(LiteralString **)&local_1f8,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_1f0,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_1a0,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF);
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)assert != local_188) {
              operator_delete(assert,local_188[0]._M_allocated_capacity * 4 + 4);
            }
            ArgParam::ArgParam((ArgParam *)&assert,*(AST **)(lVar5 + 0x80),(Fodder *)EF);
            ArgParam::ArgParam(&local_140,*(AST **)(lVar5 + 0xa8),(Fodder *)EF);
            __l._M_len = 2;
            __l._M_array = (iterator)&assert;
            ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ::vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      *)local_1e8,__l,(allocator_type *)&local_1f8);
            lVar16 = -0xb0;
            this_01 = &local_140.commaFodder;
            do {
              ::std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::~vector(this_01);
              ::std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)((long)(this_01 + -2) + 0x10));
              ::std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)((long)(this_01 + -3) + 8));
              this_01 = (Fodder *)((long)(this_01 + -4) + 8);
              lVar16 = lVar16 + 0x58;
            } while (lVar16 != 0);
            assert = (AST *)((ulong)assert & 0xffffffffffffff00);
            local_1f8 = (Index *)((ulong)local_1f8 & 0xffffffffffffff00);
            pAVar9 = Allocator::
                     make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                               (this->alloc,(LocationRange *)(lVar5 + 8),
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)(lVar5 + 0x50),(AST **)&local_1b8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                       *)local_1e8,(bool *)&assert,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)EF,(bool *)&local_1f8);
            *ast_ = &pAVar9->super_AST;
            ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ::~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                       *)local_1e8);
            return;
          }
          bVar4 = false;
        }
        pAVar9 = equals(this,(LocationRange *)(lVar5 + 8),*(AST **)(lVar5 + 0x80),
                        *(AST **)(lVar5 + 0xa8));
        *ast_ = &pAVar9->super_AST;
        if (!bVar4) {
          return;
        }
        assert = (AST *)((ulong)assert._4_4_ << 0x20);
        pCVar11 = (Conditional *)
                  Allocator::
                  make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
                            (this->alloc,(LocationRange *)(lVar5 + 8),
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)(lVar5 + 0x50),(UnaryOp *)&assert,ast_);
        goto LAB_001e7140;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
      if (lVar5 != 0) {
        return;
      }
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Conditional::typeinfo,0);
      if (lVar5 == 0) {
        lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Dollar::typeinfo,0);
        if (lVar5 != 0) {
          if (obj_level == 0) {
            this_00 = (StaticError *)__cxa_allocate_exception(0x60);
            assert = (AST *)local_188;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&assert,"No top-level object found.","");
            StaticError::StaticError(this_00,(LocationRange *)(lVar5 + 8),(string *)&assert);
            __cxa_throw(this_00,&StaticError::typeinfo,StaticError::~StaticError);
          }
          assert = (AST *)local_188;
          ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&assert,L"$",L"");
          local_1e8._0_8_ = Allocator::makeIdentifier(this->alloc,(UString *)&assert);
          pVVar7 = Allocator::
                   make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                             (this->alloc,(LocationRange *)E,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(Identifier **)local_1e8);
          *ast_ = &pVVar7->super_AST;
          pVVar7 = (Var *)assert;
          if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)assert == local_188) {
            return;
          }
          goto LAB_001e73ec;
        }
        lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Error::typeinfo,0);
        if (lVar5 == 0) {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Function::typeinfo,0);
          if (lVar5 != 0) {
            desugar(this,(AST **)(lVar5 + 0xd0),obj_level);
            desugarParams(this,(ArgParams *)(lVar5 + 0x98),obj_level);
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Import::typeinfo,0);
          if (lVar5 != 0) {
            assert = *(AST **)(lVar5 + 0x80);
            desugar(this,&assert,obj_level);
joined_r0x001e74bd:
            if (assert == (AST *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = __dynamic_cast(assert,&AST::typeinfo,&LiteralString::typeinfo,0);
            }
            *(undefined8 *)(lVar5 + 0x80) = uVar8;
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Importstr::typeinfo,0);
          if (lVar5 != 0) {
            assert = *(AST **)(lVar5 + 0x80);
            desugar(this,&assert,obj_level);
            goto joined_r0x001e74bd;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Importbin::typeinfo,0);
          if (lVar5 != 0) {
            assert = *(AST **)(lVar5 + 0x80);
            desugar(this,&assert,obj_level);
            goto joined_r0x001e74bd;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&InSuper::typeinfo,0);
          if (lVar5 != 0) goto LAB_001e6cec;
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Index::typeinfo,0);
          if (lVar5 != 0) {
            desugar(this,(AST **)(lVar5 + 0x80),obj_level);
            if (*(char *)(lVar5 + 0xa0) != '\x01') {
              if (*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **
                   )(lVar5 + 0x108) !=
                  (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                  0x0) {
                if (*(long *)(lVar5 + 0xa8) != 0) {
                  __assert_fail("ast->index == nullptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                                ,0x33a,
                                "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
                }
                assert = (AST *)CONCAT44(assert._4_4_,5);
                pLVar12 = Allocator::
                          make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                    (this->alloc,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                             **)(lVar5 + 0x108),(TokenKind *)&assert,
                                     (char (*) [1])0x25a337,(char (*) [1])0x25a337);
                *(LiteralString **)(lVar5 + 0xa8) = pLVar12;
                *(undefined8 *)(lVar5 + 0x108) = 0;
              }
              ppAVar14 = (AST **)(lVar5 + 0xa8);
LAB_001e7ae9:
              desugar(this,ppAVar14,obj_level);
              return;
            }
            ppAVar14 = (AST **)(lVar5 + 0xa8);
            if (*(long *)(lVar5 + 0xa8) == 0) {
              pAVar6 = &Allocator::
                        make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF)->super_AST;
              *ppAVar14 = pAVar6;
            }
            desugar(this,ppAVar14,obj_level);
            local_210 = (LocationRange *)(lVar5 + 200);
            if (*(long *)(lVar5 + 200) == 0) {
              pAVar6 = &Allocator::
                        make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF)->super_AST;
              *(AST **)local_210 = pAVar6;
            }
            desugar(this,(AST **)local_210,obj_level);
            local_200 = (AST **)(lVar5 + 0xe8);
            local_1c0 = lVar5;
            if (*(long *)(lVar5 + 0xe8) == 0) {
              pAVar6 = &Allocator::
                        make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF)->super_AST;
              *local_200 = pAVar6;
            }
            desugar(this,local_200,obj_level);
            local_1f0 = std(this);
            local_211 = false;
            local_1e8._0_8_ = local_1e8 + 0x10;
            ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                      ((u32string *)local_1e8,L"slice",L"");
            assert = (AST *)CONCAT44(assert._4_4_,5);
            local_1a0 = Allocator::
                        make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                          *)local_1e8,(TokenKind *)&assert,(char (*) [1])0x25a337,
                                   (char (*) [1])0x25a337);
            local_1c8 = (void *)0x0;
            local_38 = (void *)0x0;
            local_1f8 = Allocator::
                        make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_1f0,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_211,&local_1a0,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_1c8,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_38,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF);
            ArgParam::ArgParam((ArgParam *)&assert,*(AST **)(lVar5 + 0x80),(Fodder *)EF);
            ArgParam::ArgParam(&local_140,*ppAVar14,(Fodder *)EF);
            ArgParam::ArgParam(&local_e8,*(AST **)local_210,(Fodder *)EF);
            ArgParam::ArgParam(&local_90,*local_200,(Fodder *)EF);
            __l_00._M_len = 4;
            __l_00._M_array = (iterator)&assert;
            ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ::vector(&local_1b8,__l_00,&local_201);
            local_202 = false;
            local_203 = false;
            pAVar9 = Allocator::
                     make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                               (this->alloc,(LocationRange *)(local_1c0 + 8),
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_1f8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_1b8,&local_202,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)EF,&local_203);
            *ast_ = &pAVar9->super_AST;
            ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ::~vector(&local_1b8);
            lVar5 = 0x108;
            do {
              ArgParam::~ArgParam((ArgParam *)((long)&assert + lVar5));
              lVar5 = lVar5 + -0x58;
            } while (lVar5 != -0x58);
            local_188[0]._0_8_ = local_1e8._16_8_;
            pVVar7 = (Var *)local_1e8._0_8_;
            if ((Var *)local_1e8._0_8_ == (Var *)(local_1e8 + 0x10)) {
              return;
            }
LAB_001e73ec:
            operator_delete(pVVar7,local_188[0]._0_8_ * 4 + 4);
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Local::typeinfo,0);
          if (lVar5 != 0) {
            lVar17 = *(long *)(lVar5 + 0x88);
            for (lVar16 = *(long *)(lVar5 + 0x80); lVar16 != lVar17; lVar16 = lVar16 + 0xb0) {
              desugar(this,(AST **)(lVar16 + 0x38),obj_level);
            }
            desugar(this,(AST **)(lVar5 + 0x98),obj_level);
            lVar16 = *(long *)(lVar5 + 0x88);
            if (*(long *)(lVar5 + 0x80) == lVar16) {
              return;
            }
            local_210 = (LocationRange *)(lVar5 + 8);
            args_2 = (pointer *)(*(long *)(lVar5 + 0x80) + 0x48);
            do {
              if (*(char *)(args_2 + -1) == '\x01') {
                params = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                          *)(args_2 + 3);
                desugarParams(this,params,obj_level);
                assert = (AST *)((ulong)assert & 0xffffffffffffff00);
                pFVar10 = Allocator::
                          make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                                    (this->alloc,local_210,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)(lVar5 + 0x50),
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)args_2,params,(bool *)&assert,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)(args_2 + 7),(AST **)(args_2 + -2));
                args_2[-2] = (pointer)pFVar10;
                *(undefined1 *)(args_2 + -1) = 0;
                ::std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                _M_erase_at_end(params,(pointer)(((
                                                  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  *)(args_2 + 3))->
                                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                )._M_impl.super__Vector_impl_data._M_start);
              }
              lVar17 = (long)(args_2 + 0xd);
              args_2 = args_2 + 0x16;
            } while (lVar17 != lVar16);
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralNumber::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralString::typeinfo,0);
          if (lVar5 != 0) {
            if (3 < *(int *)(lVar5 + 0xa0) - 2U) {
              jsonnet_string_unescape
                        ((UString *)&assert,(LocationRange *)(lVar5 + 8),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(lVar5 + 0x80));
              ::std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
              operator=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)(lVar5 + 0x80),(UString *)&assert);
              if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                   *)assert != local_188) {
                operator_delete(assert,local_188[0]._M_allocated_capacity * 4 + 4);
              }
            }
            *(undefined4 *)(lVar5 + 0xa0) = 5;
            *(undefined8 *)(lVar5 + 0xb0) = 0;
            **(undefined1 **)(lVar5 + 0xa8) = 0;
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralNull::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&DesugaredObject::typeinfo,0);
          if (lVar5 != 0) {
            lVar16 = *(long *)(lVar5 + 0x98);
            lVar17 = *(long *)(lVar5 + 0xa0);
            obj_level_00 = (uint)local_210;
            local_200 = (AST **)lVar5;
            for (; lVar16 != lVar17; lVar16 = lVar16 + 0x18) {
              desugar(this,(AST **)(lVar16 + 8),obj_level);
              desugar(this,(AST **)(lVar16 + 0x10),obj_level_00);
            }
            plVar18 = *(long **)((long)local_200 + 0x80);
            if (plVar18 == (long *)(lVar5 + 0x80)) {
              return;
            }
            do {
              assert = (AST *)plVar18[2];
              desugar(this,&assert,(uint)local_210);
              plVar18 = (long *)*plVar18;
            } while (plVar18 != (long *)(lVar5 + 0x80));
            return;
          }
          ast_00 = (Object *)__dynamic_cast(pAVar6,&AST::typeinfo,&Object::typeinfo,0);
          if (ast_00 != (Object *)0x0) {
            pCVar11 = (Conditional *)makeObject(this,ast_00,obj_level);
            goto LAB_001e7140;
          }
          ast_01 = (ObjectComprehension *)
                   __dynamic_cast(pAVar6,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
          if (ast_01 != (ObjectComprehension *)0x0) {
            pCVar11 = (Conditional *)makeObjectComprehension(this,ast_01,obj_level);
            goto LAB_001e7140;
          }
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Parens::typeinfo,0);
            if (lVar5 != 0) {
              desugar(this,(AST **)(lVar5 + 0x80),obj_level);
              pCVar11 = *(Conditional **)(lVar5 + 0x80);
              goto LAB_001e7140;
            }
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Self::typeinfo,0);
            if (lVar5 != 0) {
              return;
            }
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&SuperIndex::typeinfo,0);
            if (lVar5 != 0) {
              if (*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **
                   )(lVar5 + 0xb8) !=
                  (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                  0x0) {
                if (*(long *)(lVar5 + 0x98) != 0) {
                  __assert_fail("ast->index == nullptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                                ,0x386,
                                "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
                }
                assert = (AST *)CONCAT44(assert._4_4_,5);
                pLVar12 = Allocator::
                          make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                    (this->alloc,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                             **)(lVar5 + 0xb8),(TokenKind *)&assert,
                                     (char (*) [1])0x25a337,(char (*) [1])0x25a337);
                *(LiteralString **)(lVar5 + 0x98) = pLVar12;
                *(undefined8 *)(lVar5 + 0xb8) = 0;
              }
              ppAVar14 = (AST **)(lVar5 + 0x98);
              goto LAB_001e7ae9;
            }
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Unary::typeinfo,0);
            if (lVar5 == 0) {
              lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Var::typeinfo,0);
              if (lVar5 != 0) {
                return;
              }
              break;
            }
            ast_ = (AST **)(lVar5 + 0x88);
          }
          else {
            desugar(this,(AST **)(lVar5 + 0x80),obj_level);
            desugar(this,(AST **)(lVar5 + 0x88),(uint)local_210);
            ast_ = (AST **)(lVar5 + 0x98);
          }
        }
        else {
LAB_001e6cec:
          ast_ = (AST **)(lVar5 + 0x80);
        }
        pAVar6 = *ast_;
      }
      else {
        desugar(this,(AST **)(lVar5 + 0x80),obj_level);
        desugar(this,(AST **)(lVar5 + 0xa0),obj_level);
        ast_ = (AST **)(lVar5 + 0xc0);
        pAVar6 = *(AST **)(lVar5 + 0xc0);
        if (pAVar6 == (AST *)0x0) {
          pAVar6 = &Allocator::
                    make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                              (this->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF)->super_AST;
          *ast_ = pAVar6;
        }
      }
    } while (pAVar6 != (AST *)0x0);
  }
  poVar13 = ::std::operator<<((ostream *)&::std::cerr,"INTERNAL ERROR: Unknown AST: ");
  poVar13 = (ostream *)::std::ostream::operator<<(poVar13,*ast_);
  ::std::endl<char,std::char_traits<char>>(poVar13);
  abort();
}

Assistant:

void desugar(AST *&ast_, unsigned obj_level)
    {
        if (auto *ast = dynamic_cast<Apply *>(ast_)) {
            desugar(ast->target, obj_level);
            for (ArgParam &arg : ast->args)
                desugar(arg.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ApplyBrace *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);
            ast_ =
                make<Binary>(ast->location, ast->openFodder, ast->left, EF, BOP_PLUS, ast->right);

        } else if (auto *ast = dynamic_cast<Array *>(ast_)) {
            for (auto &el : ast->elements)
                desugar(el.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ArrayComprehension *>(ast_)) {
            for (ComprehensionSpec &spec : ast->specs)
                desugar(spec.expr, obj_level);
            desugar(ast->body, obj_level + 1);

            ast_ = makeArrayComprehension(ast);

        } else if (auto *ast = dynamic_cast<Assert *>(ast_)) {
            desugar(ast->cond, obj_level);
            if (ast->message == nullptr) {
                ast->message = str(U"Assertion failed.");
            }
            desugar(ast->message, obj_level);
            desugar(ast->rest, obj_level);

            // if cond then rest else error msg
            AST *branch_false = make<Error>(ast->location, EF, ast->message);
            ast_ = make<Conditional>(
                ast->location, ast->openFodder, ast->cond, EF, ast->rest, EF, branch_false);

        } else if (auto *ast = dynamic_cast<Binary *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);

            bool invert = false;

            switch (ast->op) {
                case BOP_PERCENT: {
                    AST *f_mod = make<Index>(
                        E, EF, std(), EF, false, str(U"mod"), EF, nullptr, EF, nullptr, EF);
                    ArgParams args = {{ast->left, EF}, {ast->right, EF}};
                    ast_ = make<Apply>(
                        ast->location, ast->openFodder, f_mod, EF, args, false, EF, EF, false);
                } break;

                case BOP_MANIFEST_UNEQUAL: invert = true;
                [[fallthrough]];
                case BOP_MANIFEST_EQUAL: {
                    ast_ = equals(ast->location, ast->left, ast->right);
                    if (invert)
                        ast_ = make<Unary>(ast->location, ast->openFodder, UOP_NOT, ast_);
                } break;

                default:;
                    // Otherwise don't change it.
            }

        } else if (dynamic_cast<const BuiltinFunction *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<Conditional *>(ast_)) {
            desugar(ast->cond, obj_level);
            desugar(ast->branchTrue, obj_level);
            if (ast->branchFalse == nullptr)
                ast->branchFalse = null();
            desugar(ast->branchFalse, obj_level);

        } else if (auto *ast = dynamic_cast<Dollar *>(ast_)) {
            if (obj_level == 0) {
                throw StaticError(ast->location, "No top-level object found.");
            }
            ast_ = var(id(U"$"));

        } else if (auto *ast = dynamic_cast<Error *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (auto *ast = dynamic_cast<Function *>(ast_)) {
            desugar(ast->body, obj_level);
            desugarParams(ast->params, obj_level);

        } else if (auto *ast = dynamic_cast<Import *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importstr *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importbin *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<InSuper *>(ast_)) {
            desugar(ast->element, obj_level);

        } else if (auto *ast = dynamic_cast<Index *>(ast_)) {
            desugar(ast->target, obj_level);
            if (ast->isSlice) {
                if (ast->index == nullptr)
                    ast->index = null();
                desugar(ast->index, obj_level);

                if (ast->end == nullptr)
                    ast->end = null();
                desugar(ast->end, obj_level);

                if (ast->step == nullptr)
                    ast->step = null();
                desugar(ast->step, obj_level);

                ast_ = make<Apply>(
                    ast->location,
                    EF,
                    make<Index>(
                        E, EF, std(), EF, false, str(U"slice"), EF, nullptr, EF, nullptr, EF),
                    EF,
                    ArgParams{
                        {ast->target, EF},
                        {ast->index, EF},
                        {ast->end, EF},
                        {ast->step, EF},
                    },
                    false,  // trailing comma
                    EF,
                    EF,
                    false  // tailstrict
                );
            } else {
                if (ast->id != nullptr) {
                    assert(ast->index == nullptr);
                    ast->index = str(ast->id->name);
                    ast->id = nullptr;
                }
                desugar(ast->index, obj_level);
            }

        } else if (auto *ast = dynamic_cast<Local *>(ast_)) {
            for (auto &bind : ast->binds)
                desugar(bind.body, obj_level);
            desugar(ast->body, obj_level);

            for (auto &bind : ast->binds) {
                if (bind.functionSugar) {
                    desugarParams(bind.params, obj_level);
                    bind.body = make<Function>(ast->location,
                                               ast->openFodder,
                                               bind.parenLeftFodder,
                                               bind.params,
                                               false,
                                               bind.parenRightFodder,
                                               bind.body);
                    bind.functionSugar = false;
                    bind.params.clear();
                }
            }

        } else if (dynamic_cast<const LiteralBoolean *>(ast_)) {
            // Nothing to do.

        } else if (dynamic_cast<const LiteralNumber *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<LiteralString *>(ast_)) {
            if ((ast->tokenKind != LiteralString::RAW_DESUGARED) &&
                (ast->tokenKind != LiteralString::BLOCK) &&
                (ast->tokenKind != LiteralString::VERBATIM_DOUBLE) &&
                (ast->tokenKind != LiteralString::VERBATIM_SINGLE)) {
                ast->value = jsonnet_string_unescape(ast->location, ast->value);
            }
            ast->tokenKind = LiteralString::RAW_DESUGARED;
            ast->blockIndent.clear();

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<DesugaredObject *>(ast_)) {
            for (auto &field : ast->fields) {
                desugar(field.name, obj_level);
                desugar(field.body, obj_level + 1);
            }
            for (AST *assert : ast->asserts) {
                desugar(assert, obj_level + 1);
            }

        } else if (auto *ast = dynamic_cast<Object *>(ast_)) {
            ast_ = makeObject(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehension *>(ast_)) {
            ast_ = makeObjectComprehension(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehensionSimple *>(ast_)) {
            desugar(ast->field, obj_level);
            desugar(ast->value, obj_level + 1);
            desugar(ast->array, obj_level);

        } else if (auto *ast = dynamic_cast<Parens *>(ast_)) {
            // Strip parens.
            desugar(ast->expr, obj_level);
            ast_ = ast->expr;

        } else if (dynamic_cast<const Self *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<SuperIndex *>(ast_)) {
            if (ast->id != nullptr) {
                assert(ast->index == nullptr);
                ast->index = str(ast->id->name);
                ast->id = nullptr;
            }
            desugar(ast->index, obj_level);

        } else if (auto *ast = dynamic_cast<Unary *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (dynamic_cast<const Var *>(ast_)) {
            // Nothing to do.

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }